

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_nav2D.cpp
# Opt level: O3

void __thiscall
EnvironmentNAV2D::GetSuccs
          (EnvironmentNAV2D *this,int SourceStateID,vector<int,_std::allocator<int>_> *SuccIDV,
          vector<int,_std::allocator<int>_> *CostV)

{
  pointer piVar1;
  ENVHASHENTRY *pEVar2;
  uchar **ppuVar3;
  iterator iVar4;
  bool bVar5;
  vector<int,std::allocator<int>> *this_00;
  int iVar6;
  int *__args;
  undefined4 extraout_var_00;
  uchar *puVar7;
  ulong uVar8;
  ulong uVar9;
  byte bVar10;
  byte bVar11;
  int iVar12;
  ulong uVar13;
  int cost;
  int local_3c;
  vector<int,std::allocator<int>> *local_38;
  undefined4 extraout_var;
  
  piVar1 = (SuccIDV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((SuccIDV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (SuccIDV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  piVar1 = (CostV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((CostV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (CostV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
         = piVar1;
  }
  std::vector<int,_std::allocator<int>_>::reserve(SuccIDV,(long)(this->EnvNAV2DCfg).numofdirs);
  local_38 = (vector<int,std::allocator<int>> *)CostV;
  std::vector<int,_std::allocator<int>_>::reserve(CostV,(long)(this->EnvNAV2DCfg).numofdirs);
  if ((this->EnvNAV2D).goalstateid == SourceStateID) {
    return;
  }
  pEVar2 = (this->EnvNAV2D).StateID2CoordTable.
           super__Vector_base<ENVHASHENTRY_*,_std::allocator<ENVHASHENTRY_*>_>._M_impl.
           super__Vector_impl_data._M_start[SourceStateID];
  if ((((pEVar2->X < 2) || ((this->EnvNAV2DCfg).EnvWidth_c + -2 <= pEVar2->X)) || (pEVar2->Y < 2))
     || ((this->EnvNAV2DCfg).EnvHeight_c + -2 <= pEVar2->Y)) {
    bVar5 = true;
  }
  else {
    bVar5 = false;
  }
  if (0 < (this->EnvNAV2DCfg).numofdirs) {
    uVar8 = 0;
    do {
      iVar6 = pEVar2->X;
      uVar13 = (long)(this->EnvNAV2DCfg).dx_[uVar8] + (long)iVar6;
      uVar9 = (long)(this->EnvNAV2DCfg).dy_[uVar8] + (long)pEVar2->Y;
      if (bVar5) {
        iVar6 = (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x37])
                          (this,uVar13 & 0xffffffff,uVar9 & 0xffffffff);
        if ((char)iVar6 != '\0') {
          iVar6 = pEVar2->X;
          goto LAB_00121649;
        }
      }
      else {
LAB_00121649:
        ppuVar3 = (this->EnvNAV2DCfg).Grid2D;
        puVar7 = ppuVar3[uVar13];
        bVar10 = puVar7[uVar9];
        if ((((int)uVar13 == iVar6) || (7 < uVar8)) || (iVar12 = pEVar2->Y, (int)uVar9 == iVar12)) {
          if (7 < uVar8) {
            if (bVar10 <= ppuVar3[(long)(this->EnvNAV2DCfg).dxintersects_[uVar8][0] + (long)iVar6]
                          [(long)(this->EnvNAV2DCfg).dyintersects_[uVar8][0] + (long)pEVar2->Y]) {
              bVar10 = ppuVar3[(long)(this->EnvNAV2DCfg).dxintersects_[uVar8][0] + (long)iVar6]
                       [(long)(this->EnvNAV2DCfg).dyintersects_[uVar8][0] + (long)pEVar2->Y];
            }
            puVar7 = ppuVar3[(long)(this->EnvNAV2DCfg).dxintersects_[uVar8][1] + (long)iVar6];
            iVar12 = (this->EnvNAV2DCfg).dyintersects_[uVar8][1] + pEVar2->Y;
            bVar11 = bVar10;
            goto LAB_001216cc;
          }
        }
        else {
          bVar11 = ppuVar3[iVar6][uVar9];
          if (ppuVar3[iVar6][uVar9] < bVar10) {
            bVar11 = bVar10;
          }
LAB_001216cc:
          bVar10 = puVar7[iVar12];
          if (puVar7[iVar12] < bVar11) {
            bVar10 = bVar11;
          }
        }
        if (bVar10 < (this->EnvNAV2DCfg).obsthresh) {
          local_3c = (bVar10 + 1) * (this->EnvNAV2DCfg).dxy_distance_mm_[uVar8];
          iVar6 = (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x33])
                            (this,uVar13 & 0xffffffff,uVar9 & 0xffffffff);
          __args = (int *)CONCAT44(extraout_var,iVar6);
          if (__args == (int *)0x0) {
            iVar6 = (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x34])
                              (this,uVar13 & 0xffffffff,uVar9 & 0xffffffff);
            __args = (int *)CONCAT44(extraout_var_00,iVar6);
          }
          this_00 = local_38;
          iVar4._M_current =
               (SuccIDV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (SuccIDV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)SuccIDV,iVar4,__args);
          }
          else {
            *iVar4._M_current = *__args;
            (SuccIDV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_finish = iVar4._M_current + 1;
          }
          iVar4._M_current = *(int **)(this_00 + 8);
          if (iVar4._M_current == *(int **)(this_00 + 0x10)) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (this_00,iVar4,&local_3c);
          }
          else {
            *iVar4._M_current = local_3c;
            *(int **)(this_00 + 8) = iVar4._M_current + 1;
          }
        }
      }
      uVar8 = uVar8 + 1;
    } while ((long)uVar8 < (long)(this->EnvNAV2DCfg).numofdirs);
  }
  return;
}

Assistant:

void EnvironmentNAV2D::GetSuccs(int SourceStateID, vector<int>* SuccIDV, vector<int>* CostV)
{
    int aind;

#if TIME_DEBUG
    clock_t currenttime = clock();
#endif

    //clear the successor array
    SuccIDV->clear();
    CostV->clear();
    SuccIDV->reserve(EnvNAV2DCfg.numofdirs);
    CostV->reserve(EnvNAV2DCfg.numofdirs);

    //goal state should be absorbing
    if (SourceStateID == EnvNAV2D.goalstateid) return;

    //get X, Y for the state
    EnvNAV2DHashEntry_t* HashEntry = EnvNAV2D.StateID2CoordTable[SourceStateID];

    //iterate through actions
    bool bTestBounds = false;
    if (HashEntry->X <= 1 || HashEntry->X >= EnvNAV2DCfg.EnvWidth_c - 2 || HashEntry->Y <= 1 ||
        HashEntry->Y >= EnvNAV2DCfg.EnvHeight_c - 2)
    {
        bTestBounds = true;
    }
    for (aind = 0; aind < EnvNAV2DCfg.numofdirs; aind++) {
        int newX = HashEntry->X + EnvNAV2DCfg.dx_[aind];
        int newY = HashEntry->Y + EnvNAV2DCfg.dy_[aind];

        //skip the invalid cells
        if (bTestBounds) {
            if (!IsValidCell(newX, newY)) continue;
        }

        int costmult = EnvNAV2DCfg.Grid2D[newX][newY];

        //for diagonal move, take max over adjacent cells
        if (newX != HashEntry->X && newY != HashEntry->Y && aind <= 7) {
            costmult = __max(costmult, EnvNAV2DCfg.Grid2D[HashEntry->X][newY]);
            costmult = __max(costmult, EnvNAV2DCfg.Grid2D[newX][HashEntry->Y]);
        }
        else if (aind > 7) {
            //check two more cells through which the action goes
            costmult = __max(costmult,
                             EnvNAV2DCfg.Grid2D[HashEntry->X + EnvNAV2DCfg.dxintersects_[aind][0]][HashEntry->Y
                                 + EnvNAV2DCfg.dyintersects_[aind][0]]);
            costmult = __max(costmult,
                             EnvNAV2DCfg.Grid2D[HashEntry->X + EnvNAV2DCfg.dxintersects_[aind][1]][HashEntry->Y
                                 + EnvNAV2DCfg.dyintersects_[aind][1]]);
        }

        //check that it is valid
        if (costmult >= EnvNAV2DCfg.obsthresh) continue;

        //otherwise compute the actual cost
        int cost = (costmult + 1) * EnvNAV2DCfg.dxy_distance_mm_[aind];

        EnvNAV2DHashEntry_t* OutHashEntry;
        if ((OutHashEntry = GetHashEntry(newX, newY)) == NULL) {
            //have to create a new entry
            OutHashEntry = CreateNewHashEntry(newX, newY);
        }

        SuccIDV->push_back(OutHashEntry->stateID);
        CostV->push_back(cost);
    }

#if TIME_DEBUG
    time_getsuccs += clock()-currenttime;
#endif
}